

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependent_quantity.h
# Opt level: O2

void __thiscall
geometrycentral::
DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Vertex,_double>_>::
~DependentQuantityD(DependentQuantityD<geometrycentral::MeshData<geometrycentral::surface::Vertex,_double>_>
                    *this)

{
  DependentQuantity::~DependentQuantity(&this->super_DependentQuantity);
  operator_delete(this);
  return;
}

Assistant:

DependentQuantityD(){}